

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dmp.cc
# Opt level: O0

void anon_unknown.dwarf_ba9::PrintUsage(ostream *stream)

{
  ostream *poVar1;
  ostream *in_RDI;
  allocator local_229;
  string local_228 [39];
  allocator local_201;
  string local_200 [39];
  allocator local_1d9;
  string local_1d8 [39];
  allocator local_1b1;
  string local_1b0 [39];
  allocator local_189;
  string local_188 [39];
  allocator local_161;
  string local_160 [39];
  allocator local_139;
  string local_138 [39];
  allocator local_111;
  string local_110 [39];
  allocator local_e9;
  string local_e8 [39];
  allocator local_c1;
  string local_c0 [39];
  allocator local_99;
  string local_98 [16];
  ostream *in_stack_ffffffffffffff78;
  string *in_stack_ffffffffffffff80;
  allocator local_71;
  string local_70 [55];
  allocator local_39;
  string local_38 [32];
  int local_18;
  int local_14;
  int local_10;
  int local_c;
  ostream *local_8;
  
  local_8 = in_RDI;
  std::ostream::operator<<(in_RDI,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(local_8," dmp - binary file dump");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(local_8,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(local_8,"  usage:");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(local_8,"       dmp [ options ] [ infile ] > stdout");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(local_8,"  options:");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(local_8,"       -l l  : block length       (   int)[");
  local_c = (int)std::setw(5);
  poVar1 = std::operator<<(poVar1,(_Setw)local_c);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::right);
  poVar1 = std::operator<<(poVar1,"EOS");
  poVar1 = std::operator<<(poVar1,"][ 1 <= l <=   ]");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(local_8,"       -m m  : block order        (   int)[");
  local_10 = (int)std::setw(5);
  poVar1 = std::operator<<(poVar1,(_Setw)local_10);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::right);
  poVar1 = std::operator<<(poVar1,"EOS");
  poVar1 = std::operator<<(poVar1,"][ 0 <= m <=   ]");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(local_8,"       -f f  : print format       (string)[");
  local_14 = (int)std::setw(5);
  poVar1 = std::operator<<(poVar1,(_Setw)local_14);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::right);
  poVar1 = std::operator<<(poVar1,"N/A");
  poVar1 = std::operator<<(poVar1,"]");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(local_8,"       +type : data type                  [");
  local_18 = (int)std::setw(5);
  poVar1 = std::operator<<(poVar1,(_Setw)local_18);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::right);
  poVar1 = std::operator<<(poVar1,(anonymous_namespace)::kDefaultDataType);
  poVar1 = std::operator<<(poVar1,"]");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::operator<<(local_8,"                 ");
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"c",&local_39);
  sptk::PrintDataType(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_70,"C",&local_71);
  sptk::PrintDataType(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  std::ostream::operator<<(local_8,std::endl<char,std::char_traits<char>>);
  std::operator<<(local_8,"                 ");
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_98,"s",&local_99);
  sptk::PrintDataType(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  std::__cxx11::string::~string(local_98);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c0,"S",&local_c1);
  sptk::PrintDataType(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  std::__cxx11::string::~string(local_c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  std::ostream::operator<<(local_8,std::endl<char,std::char_traits<char>>);
  std::operator<<(local_8,"                 ");
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e8,"h",&local_e9);
  sptk::PrintDataType(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  std::__cxx11::string::~string(local_e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_110,"H",&local_111);
  sptk::PrintDataType(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  std::__cxx11::string::~string(local_110);
  std::allocator<char>::~allocator((allocator<char> *)&local_111);
  std::ostream::operator<<(local_8,std::endl<char,std::char_traits<char>>);
  std::operator<<(local_8,"                 ");
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_138,"i",&local_139);
  sptk::PrintDataType(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  std::__cxx11::string::~string(local_138);
  std::allocator<char>::~allocator((allocator<char> *)&local_139);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_160,"I",&local_161);
  sptk::PrintDataType(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  std::__cxx11::string::~string(local_160);
  std::allocator<char>::~allocator((allocator<char> *)&local_161);
  std::ostream::operator<<(local_8,std::endl<char,std::char_traits<char>>);
  std::operator<<(local_8,"                 ");
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_188,"l",&local_189);
  sptk::PrintDataType(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  std::__cxx11::string::~string(local_188);
  std::allocator<char>::~allocator((allocator<char> *)&local_189);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1b0,"L",&local_1b1);
  sptk::PrintDataType(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  std::__cxx11::string::~string(local_1b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b1);
  std::ostream::operator<<(local_8,std::endl<char,std::char_traits<char>>);
  std::operator<<(local_8,"                 ");
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1d8,"f",&local_1d9);
  sptk::PrintDataType(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  std::__cxx11::string::~string(local_1d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_200,"d",&local_201);
  sptk::PrintDataType(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  std::__cxx11::string::~string(local_200);
  std::allocator<char>::~allocator((allocator<char> *)&local_201);
  std::ostream::operator<<(local_8,std::endl<char,std::char_traits<char>>);
  std::operator<<(local_8,"                 ");
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_228,"e",&local_229);
  sptk::PrintDataType(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  std::__cxx11::string::~string(local_228);
  std::allocator<char>::~allocator((allocator<char> *)&local_229);
  std::ostream::operator<<(local_8,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(local_8,"       -h    : print this message");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(local_8,"  infile:");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(local_8,"       data sequence              (  type)[stdin]");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(local_8,"  stdout:");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(local_8,"       dumped data sequence       (string)");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(local_8,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(local_8," SPTK: version ");
  poVar1 = std::operator<<(poVar1,"4.3");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(local_8,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void PrintUsage(std::ostream* stream) {
  // clang-format off
  *stream << std::endl;
  *stream << " dmp - binary file dump" << std::endl;
  *stream << std::endl;
  *stream << "  usage:" << std::endl;
  *stream << "       dmp [ options ] [ infile ] > stdout" << std::endl;
  *stream << "  options:" << std::endl;
  *stream << "       -l l  : block length       (   int)[" << std::setw(5) << std::right << "EOS"            << "][ 1 <= l <=   ]" << std::endl;  // NOLINT
  *stream << "       -m m  : block order        (   int)[" << std::setw(5) << std::right << "EOS"            << "][ 0 <= m <=   ]" << std::endl;  // NOLINT
  *stream << "       -f f  : print format       (string)[" << std::setw(5) << std::right << "N/A"            << "]" << std::endl;  // NOLINT
  *stream << "       +type : data type                  [" << std::setw(5) << std::right << kDefaultDataType << "]" << std::endl;  // NOLINT
  *stream << "                 "; sptk::PrintDataType("c", stream); sptk::PrintDataType("C", stream); *stream << std::endl;  // NOLINT
  *stream << "                 "; sptk::PrintDataType("s", stream); sptk::PrintDataType("S", stream); *stream << std::endl;  // NOLINT
  *stream << "                 "; sptk::PrintDataType("h", stream); sptk::PrintDataType("H", stream); *stream << std::endl;  // NOLINT
  *stream << "                 "; sptk::PrintDataType("i", stream); sptk::PrintDataType("I", stream); *stream << std::endl;  // NOLINT
  *stream << "                 "; sptk::PrintDataType("l", stream); sptk::PrintDataType("L", stream); *stream << std::endl;  // NOLINT
  *stream << "                 "; sptk::PrintDataType("f", stream); sptk::PrintDataType("d", stream); *stream << std::endl;  // NOLINT
  *stream << "                 "; sptk::PrintDataType("e", stream);                                   *stream << std::endl;  // NOLINT
  *stream << "       -h    : print this message" << std::endl;
  *stream << "  infile:" << std::endl;
  *stream << "       data sequence              (  type)[stdin]" << std::endl;
  *stream << "  stdout:" << std::endl;
  *stream << "       dumped data sequence       (string)" << std::endl;
  *stream << std::endl;
  *stream << " SPTK: version " << sptk::kVersion << std::endl;
  *stream << std::endl;
  // clang-format on
}